

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

int ref_nonsingle_cell(saucy *s,coloring *c,int cf)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int *piVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  
  piVar3 = c->lab;
  iVar13 = c->clen[cf] + cf;
  iVar7 = s->conncnts[cf];
  iVar6 = iVar13 - iVar7;
  lVar12 = (long)iVar6;
  iVar8 = iVar6 + 1;
  piVar4 = s->ccount;
  piVar5 = s->count;
  iVar16 = piVar4[piVar3[lVar12 + 1]];
  uVar11 = (ulong)iVar16;
  piVar5[lVar12 + 1] = iVar16;
  piVar14 = s->bucket;
  piVar14[uVar11] = 1;
  iVar10 = iVar16;
  if (iVar8 < iVar13) {
    lVar15 = (long)(iVar6 + 2);
    do {
      uVar1 = piVar4[piVar3[lVar15]];
      if ((int)uVar1 < iVar16) {
        lVar17 = (long)iVar16;
        memset(piVar14 + (lVar17 - (ulong)(~uVar1 + iVar16)) + -1,0,(ulong)(~uVar1 + iVar16) * 4 + 4
              );
        do {
          lVar17 = lVar17 + -1;
        } while ((int)uVar1 < lVar17);
        iVar16 = (int)lVar17;
      }
      uVar9 = (uint)uVar11;
      if ((int)uVar9 < (int)uVar1) {
        memset(piVar14 + (long)(int)uVar9 + 1,0,(ulong)(~uVar9 + uVar1) * 4 + 4);
        uVar11 = (ulong)uVar1;
      }
      iVar10 = (int)uVar11;
      piVar14[(int)uVar1] = piVar14[(int)uVar1] + 1;
      piVar5[lVar15] = uVar1;
      lVar15 = lVar15 + 1;
    } while (iVar13 + 1 != (int)lVar15);
  }
  if ((iVar8 != cf) || (iVar16 != iVar10)) {
    if (iVar16 <= iVar10) {
      lVar15 = 0;
      iVar6 = iVar8;
      do {
        if (piVar14[iVar16 + lVar15] != 0) {
          iVar6 = iVar6 + piVar14[iVar16 + lVar15];
          piVar14[iVar16 + lVar15] = iVar6;
        }
        lVar15 = lVar15 + 1;
      } while ((iVar10 - iVar16) + 1 != (int)lVar15);
    }
    if (0 < iVar7) {
      piVar4 = s->junk;
      lVar15 = lVar12;
      do {
        iVar6 = piVar3[lVar15 + 1];
        iVar2 = piVar14[piVar5[lVar15 + 1]];
        piVar14[piVar5[lVar15 + 1]] = iVar2 + -1;
        piVar4[(long)iVar2 + -1] = iVar6;
        lVar15 = lVar15 + 1;
      } while (lVar15 < iVar13);
      if (0 < iVar7) {
        piVar4 = s->junk;
        piVar5 = c->unlab;
        do {
          iVar7 = piVar4[lVar12 + 1];
          piVar3[lVar12 + 1] = iVar7;
          piVar5[iVar7] = iVar8;
          lVar12 = lVar12 + 1;
          iVar8 = iVar8 + 1;
        } while (lVar12 < iVar13);
      }
    }
    if (iVar16 < iVar10) {
      lVar12 = (long)iVar10;
      do {
        if ((s->bucket[lVar12] != 0) && (iVar7 = (*s->split)(s,c,cf,s->bucket[lVar12]), iVar7 == 0))
        {
          return 0;
        }
        lVar12 = lVar12 + -1;
      } while (iVar16 < lVar12);
      piVar14 = s->bucket;
    }
    if (piVar14[iVar16] != cf) {
      iVar7 = (*s->split)(s,c,cf,piVar14[iVar16]);
      return iVar7;
    }
  }
  return 1;
}

Assistant:

static int
ref_nonsingle_cell(struct saucy *s, struct coloring *c, int cf)
{
    int cnt, i, cb, nzf, ff, fb, bmin, bmax;

    /* Find the front and back */
    cb = cf + c->clen[cf];
    nzf = cb - s->conncnts[cf] + 1;

    /* Prepare the buckets */
    ff = nzf;
    cnt = s->ccount[c->lab[ff]];
    s->count[ff] = bmin = bmax = cnt;
    s->bucket[cnt] = 1;

    /* Iterate through the rest of the vertices */
    while (++ff <= cb) {
        cnt = s->ccount[c->lab[ff]];

        /* Initialize intermediate buckets */
        while (bmin > cnt) s->bucket[--bmin] = 0;
        while (bmax < cnt) s->bucket[++bmax] = 0;

        /* Mark this count */
        ++s->bucket[cnt];
        s->count[ff] = cnt;
    }

    /* If they all had the same count, bail */
    if (bmin == bmax && cf == nzf) return 1;
    ff = fb = nzf;

    /* Calculate bucket locations, sizes */
    for (i = bmin; i <= bmax; ++i, ff = fb) {
        if (!s->bucket[i]) continue;
        fb = ff + s->bucket[i];
        s->bucket[i] = fb;
    }

    /* Repair the partition nest */
    for (i = nzf; i <= cb; ++i) {
        s->junk[--s->bucket[s->count[i]]] = c->lab[i];
    }
    for (i = nzf; i <= cb; ++i) {
        set_label(c, i, s->junk[i]);
    }

    /* Split; induce */
    for (i = bmax; i > bmin; --i) {
        ff = s->bucket[i];
        if (ff && !s->split(s, c, cf, ff)) return 0;
    }

    /* If there was a zero area, then there's one more cell */
    return maybe_split(s, c, cf, s->bucket[bmin]);
}